

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int archive_read_format_cpio_bid(archive_read *a,int best_bid)

{
  void *pvVar1;
  int iVar2;
  byte *__s1;
  int local_34;
  int bid;
  cpio *cpio;
  uchar *p;
  int best_bid_local;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  __s1 = (byte *)__archive_read_ahead(a,6,(ssize_t *)0x0);
  if (__s1 == (byte *)0x0) {
    a_local._4_4_ = -1;
  }
  else {
    iVar2 = memcmp(__s1,"070707",6);
    if (iVar2 == 0) {
      *(code **)((long)pvVar1 + 8) = header_odc;
      local_34 = 0x30;
    }
    else {
      iVar2 = memcmp(__s1,"070727",6);
      if (iVar2 == 0) {
        *(code **)((long)pvVar1 + 8) = header_odc;
        local_34 = 0x30;
      }
      else {
        iVar2 = memcmp(__s1,"070701",6);
        if (iVar2 == 0) {
          *(code **)((long)pvVar1 + 8) = header_newc;
          local_34 = 0x30;
        }
        else {
          iVar2 = memcmp(__s1,"070702",6);
          if (iVar2 == 0) {
            *(code **)((long)pvVar1 + 8) = header_newc;
            local_34 = 0x30;
          }
          else {
            if ((uint)*__s1 * 0x100 + (uint)__s1[1] == 0x71c7) {
              *(code **)((long)pvVar1 + 8) = header_bin_be;
            }
            else {
              if ((uint)*__s1 + (uint)__s1[1] * 0x100 != 0x71c7) {
                return -0x14;
              }
              *(code **)((long)pvVar1 + 8) = header_bin_le;
            }
            local_34 = 0x10;
          }
        }
      }
    }
    a_local._4_4_ = local_34;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_cpio_bid(struct archive_read *a, int best_bid)
{
	const unsigned char *p;
	struct cpio *cpio;
	int bid;

	(void)best_bid; /* UNUSED */

	cpio = (struct cpio *)(a->format->data);

	if ((p = __archive_read_ahead(a, 6, NULL)) == NULL)
		return (-1);

	bid = 0;
	if (memcmp(p, "070707", 6) == 0) {
		/* ASCII cpio archive (odc, POSIX.1) */
		cpio->read_header = header_odc;
		bid += 48;
		/*
		 * XXX TODO:  More verification; Could check that only octal
		 * digits appear in appropriate header locations. XXX
		 */
	} else if (memcmp(p, "070727", 6) == 0) {
		/* afio large ASCII cpio archive */
		cpio->read_header = header_odc;
		bid += 48;
		/*
		 * XXX TODO:  More verification; Could check that almost hex
		 * digits appear in appropriate header locations. XXX
		 */
	} else if (memcmp(p, "070701", 6) == 0) {
		/* ASCII cpio archive (SVR4 without CRC) */
		cpio->read_header = header_newc;
		bid += 48;
		/*
		 * XXX TODO:  More verification; Could check that only hex
		 * digits appear in appropriate header locations. XXX
		 */
	} else if (memcmp(p, "070702", 6) == 0) {
		/* ASCII cpio archive (SVR4 with CRC) */
		/* XXX TODO: Flag that we should check the CRC. XXX */
		cpio->read_header = header_newc;
		bid += 48;
		/*
		 * XXX TODO:  More verification; Could check that only hex
		 * digits appear in appropriate header locations. XXX
		 */
	} else if (p[0] * 256 + p[1] == 070707) {
		/* big-endian binary cpio archives */
		cpio->read_header = header_bin_be;
		bid += 16;
		/* Is more verification possible here? */
	} else if (p[0] + p[1] * 256 == 070707) {
		/* little-endian binary cpio archives */
		cpio->read_header = header_bin_le;
		bid += 16;
		/* Is more verification possible here? */
	} else
		return (ARCHIVE_WARN);

	return (bid);
}